

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O0

void __thiscall BayesianGameBase::SanityCheckBGBase(BayesianGameBase *this)

{
  bool bVar1;
  ostream *poVar2;
  const_reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  E *this_00;
  long *in_RDI;
  double dVar6;
  stringstream ss;
  Index jtI;
  const_iterator it;
  double p;
  derived_iterator_type *in_stack_fffffffffffffd68;
  const_iterator *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd80;
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *in_stack_fffffffffffffd88;
  string local_228 [36];
  int local_204;
  stringstream local_200 [16];
  ostream local_1f0 [380];
  uint local_74;
  double local_10;
  
  local_10 = 0.0;
  if ((*(byte *)((long)in_RDI + 0xc1) & 1) == 0) {
    if ((*(byte *)(in_RDI + 1) & 1) == 0) {
      for (local_74 = 0; uVar4 = (ulong)local_74,
          sVar5 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 2)), uVar4 < sVar5
          ; local_74 = local_74 + 1) {
        dVar6 = (double)(**(code **)(*in_RDI + 0x68))(in_RDI,local_74);
        local_10 = dVar6 + local_10;
      }
    }
    else {
      boost::numeric::ublas::
      mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
      ::begin(in_stack_fffffffffffffd88);
      boost::numeric::ublas::
      mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
      ::const_iterator::const_iterator
                (in_stack_fffffffffffffd70,(iterator *)in_stack_fffffffffffffd68);
      boost::numeric::ublas::
      mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
      ::iterator::~iterator((iterator *)0x8a8cc4);
      while( true ) {
        boost::numeric::ublas::
        mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
        ::end(in_stack_fffffffffffffd88);
        boost::numeric::ublas::
        mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
        ::const_iterator::const_iterator
                  (in_stack_fffffffffffffd70,(iterator *)in_stack_fffffffffffffd68);
        bVar1 = boost::numeric::ublas::
                bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>::const_iterator,_double>
                ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>::const_iterator,_double>
                              *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        boost::numeric::ublas::
        mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
        ::const_iterator::~const_iterator((const_iterator *)0x8a8d1b);
        boost::numeric::ublas::
        mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
        ::iterator::~iterator((iterator *)0x8a8d28);
        if (!bVar1) break;
        pvVar3 = boost::numeric::ublas::
                 mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
                 ::const_iterator::operator*((const_iterator *)0x8a8dd8);
        local_10 = *pvVar3 + local_10;
        boost::numeric::ublas::operator++
                  ((derived_iterator_type *)in_stack_fffffffffffffd88,
                   (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
        boost::numeric::ublas::
        mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
        ::const_iterator::~const_iterator((const_iterator *)0x8a8e20);
      }
      boost::numeric::ublas::
      mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
      ::const_iterator::~const_iterator((const_iterator *)0x8a8d41);
    }
    bVar1 = Globals::EqualProbability
                      ((double)in_stack_fffffffffffffd70,(double)in_stack_fffffffffffffd68);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_200);
      poVar2 = std::operator<<(local_1f0,
                               "BayesianGameBase::SanityCheck() Warning, total probability of joint types does not sum to 1.0, "
                              );
      poVar2 = std::operator<<(poVar2,"but to ");
      local_204 = (int)std::setprecision(0x10);
      poVar2 = std::operator<<(poVar2,(_Setprecision)local_204);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
      std::operator<<(poVar2,"! ");
      dVar6 = local_10 + -1.0;
      std::abs((int)poVar2);
      if (1e-09 <= dVar6) {
        this_00 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_00,(stringstream *)in_stack_fffffffffffffd68);
        __cxa_throw(this_00,&E::typeinfo,E::~E);
      }
      poVar2 = std::operator<<(local_1f0,
                               "Since the difference is < 1e-9, we should just renormalize... (not yet implemented...)"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      std::operator<<((ostream *)&std::cerr,local_228);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::stringstream::~stringstream(local_200);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "\n!!! BayesianGameBase::SanityCheck() aborted since the joint types are overflowing. BayesianGameBase really is ill-suited for this situation and a new implementation needs to be created for this case!!! Only leaving this now such that we can run experiments for the JAAMAS paper...\n"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void
BayesianGameBase::SanityCheckBGBase()
{
    double p=0.0;
    if (_m_JToverflow)
    {
        cout << "\n!!! BayesianGameBase::SanityCheck() aborted since the joint types are overflowing. BayesianGameBase really is ill-suited for this situation and a new implementation needs to be created for this case!!! Only leaving this now such that we can run experiments for the JAAMAS paper...\n"<< endl;
        return;
    }

    if(_m_useSparse)
    {
        for( SparseVector::const_iterator it = _m_jTypeProbsSparse.begin(); 
                it != _m_jTypeProbsSparse.end();
                it++)
            p += *it;
        //throw E("BayesianGameBase::SanityCheck() not yet implemented for sparse stuff");

    }
    else
    {
        for(Index jtI=0; jtI < _m_jTypeProbs.size(); jtI++)
            p += GetProbability(jtI);
    }

    if(! Globals::EqualProbability(p, 1.0) )
    {
        stringstream ss;
        ss << "BayesianGameBase::SanityCheck() Warning, total probability of joint types does not sum to 1.0, "
            << "but to "<<setprecision(16) << p<<"! ";
        if(  abs(p - 1.0) < 1e-9  )
        {
            ss << "Since the difference is < 1e-9, we should just renormalize... (not yet implemented...)"<<endl;
            cerr << ss.str();
        }
        else
            throw(E(ss));
    }
    return;
}